

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ostream.h
# Opt level: O0

WifiDebugOstream * operator<<(WifiDebugOstream *sink,uint i)

{
  char local_15;
  uint local_14;
  char c;
  WifiDebugOstream *pWStack_10;
  uint i_local;
  WifiDebugOstream *sink_local;
  
  local_14 = i;
  pWStack_10 = sink;
  if (9 < i) {
    operator<<(sink,i / 10);
  }
  local_15 = (char)((ulong)local_14 % 10) + '0';
  WifiDebugOstream::write(pWStack_10,(int)&local_15,(void *)0x1,10);
  return pWStack_10;
}

Assistant:

T& operator<<( T& sink, unsigned int i )
{
  // Handle digits that aren't the lowest digit (if any)
  if ( i >= 10 )
  {
    sink << i/10;
  }

  // Handle the lowest digit
  char c = '0' + (i % 10);
  sink.write( &c, 1 );

  return sink;
}